

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void __thiscall kj::anon_unknown_36::WebSocketPipeImpl::BlockedPumpTo::abort(BlockedPumpTo *this)

{
  WebSocketPipeImpl *this_00;
  StringPtr cancelReason;
  undefined1 local_9;
  
  cancelReason.content.size_ = 0x29;
  cancelReason.content.ptr = "other end of WebSocketPipe was destroyed";
  Canceler::cancel(&this->canceler,cancelReason);
  (*(this->fulfiller->super_PromiseRejector)._vptr_PromiseRejector[2])(this->fulfiller,&local_9);
  this_00 = this->pipe;
  if ((BlockedPumpTo *)(this_00->state).ptr == this) {
    (this_00->state).ptr = (WebSocket *)0x0;
  }
  WebSocketPipeImpl::abort(this_00);
  return;
}

Assistant:

void abort() override {
      canceler.cancel("other end of WebSocketPipe was destroyed");

      // abort() is called when the pipe end is dropped. This should be treated as disconnecting,
      // so pumpTo() should complete normally.
      fulfiller.fulfill();

      pipe.endState(*this);
      pipe.abort();
    }